

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_combiner.cpp
# Opt level: O2

FilterPushdownResult __thiscall
duckdb::FilterCombiner::TryPushdownExpression
          (FilterCombiner *this,LogicalGet *get,TableFilterSet *table_filters,
          vector<duckdb::ColumnIndex,_true> *column_ids,Expression *expr)

{
  FilterPushdownResult FVar1;
  
  FVar1 = TryPushdownPrefixFilter(this,table_filters,column_ids,expr);
  if (FVar1 == NO_PUSHDOWN) {
    FVar1 = TryPushdownLikeFilter(this,table_filters,column_ids,expr);
    if (FVar1 == NO_PUSHDOWN) {
      FVar1 = TryPushdownInFilter(this,table_filters,column_ids,expr);
      if (FVar1 == NO_PUSHDOWN) {
        FVar1 = TryPushdownOrClause(this,table_filters,column_ids,expr);
        FVar1 = (FilterPushdownResult)(FVar1 != NO_PUSHDOWN);
      }
    }
  }
  return FVar1;
}

Assistant:

FilterPushdownResult FilterCombiner::TryPushdownExpression(const LogicalGet &get, TableFilterSet &table_filters,
                                                           const vector<ColumnIndex> &column_ids, Expression &expr) {
	auto pushdown_result = TryPushdownPrefixFilter(table_filters, column_ids, expr);
	if (pushdown_result != FilterPushdownResult::NO_PUSHDOWN) {
		return pushdown_result;
	}
	pushdown_result = TryPushdownLikeFilter(table_filters, column_ids, expr);
	if (pushdown_result != FilterPushdownResult::NO_PUSHDOWN) {
		return pushdown_result;
	}
	pushdown_result = TryPushdownInFilter(table_filters, column_ids, expr);
	if (pushdown_result != FilterPushdownResult::NO_PUSHDOWN) {
		return pushdown_result;
	}
	pushdown_result = TryPushdownOrClause(table_filters, column_ids, expr);
	if (pushdown_result != FilterPushdownResult::NO_PUSHDOWN) {
		return pushdown_result;
	}
	return FilterPushdownResult::NO_PUSHDOWN;
}